

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

void __thiscall nite::Polygon::rectangle(Polygon *this,float w,float h)

{
  pointer pVVar1;
  Vec2 local_28;
  float local_20;
  float local_1c;
  
  pVVar1 = (this->vert).super__Vector_base<nite::Vec2,_std::allocator<nite::Vec2>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vert).super__Vector_base<nite::Vec2,_std::allocator<nite::Vec2>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->vert).super__Vector_base<nite::Vec2,_std::allocator<nite::Vec2>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  (this->origin).x = w * 0.5;
  (this->origin).y = h * 0.5;
  local_28.x = 0.0;
  local_28.y = 0.0;
  local_20 = w;
  local_1c = h;
  std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::emplace_back<nite::Vec2>
            (&this->vert,&local_28);
  local_28.y = 0.0;
  local_28.x = local_20;
  std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::emplace_back<nite::Vec2>
            (&this->vert,&local_28);
  local_28.y = local_1c;
  local_28.x = local_20;
  std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::emplace_back<nite::Vec2>
            (&this->vert,&local_28);
  local_28 = (Vec2)((ulong)(uint)local_1c << 0x20);
  std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::emplace_back<nite::Vec2>
            (&this->vert,&local_28);
  return;
}

Assistant:

void nite::Polygon::rectangle(float w, float h){
	clear();
	origin.set(w * 0.5f, h * 0.5f);
	vert.push_back(nite::Vec2(0, 0));
	vert.push_back(nite::Vec2(w, 0));
	vert.push_back(nite::Vec2(w, h));
	vert.push_back(nite::Vec2(0, h));
}